

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

bool __thiscall
glcts::ProgramUniformCase::setAndCompareMatrixUniforms
          (ProgramUniformCase *this,GLuint pipeline,GLuint programA,GLuint programB,DataType dType,
          int seed)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  GLint GVar4;
  TestLog *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  undefined8 uVar7;
  TestError *pTVar8;
  GLint *local_830;
  float local_7b8 [2];
  float retVal [16];
  GLint *location;
  float local_768;
  GLuint activeProgram;
  float retValB_1 [16];
  float retValA_1 [16];
  float retValB [16];
  float retValA [16];
  float *value;
  string local_640;
  string local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  undefined1 local_560 [8];
  string name_1;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [8];
  string name;
  allocator<char> local_2e9;
  undefined1 local_2e8 [8];
  string uniformBaseName;
  int local_2c0;
  int k;
  int j;
  int i;
  float data [104];
  int **ppiStack_110;
  int maxDataCount;
  int *floatCount;
  int floatCountNonSqu [12];
  int floatCountSqu [12];
  GLint locationB [12];
  GLint locationA [12];
  int arraySize;
  int numUniforms;
  int maxUniforms;
  bool isSquareMat;
  Functions *gl;
  TestLog *log;
  int seed_local;
  DataType dType_local;
  GLuint programB_local;
  GLuint programA_local;
  GLuint pipeline_local;
  ProgramUniformCase *this_local;
  long lVar6;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  bVar2 = isDataTypeSquareMatrix(this,dType);
  floatCountSqu[6] = 0;
  floatCountSqu[7] = 0;
  floatCountSqu[8] = 0;
  floatCountSqu[9] = 0;
  floatCountSqu[4] = 0;
  floatCountSqu[5] = 0;
  floatCountNonSqu[10] = 4;
  floatCountNonSqu[0xb] = 4;
  floatCountSqu[0] = 9;
  floatCountSqu[1] = 9;
  floatCountSqu[2] = 0x10;
  floatCountSqu[3] = 0x10;
  floatCountNonSqu[6] = 8;
  floatCountNonSqu[7] = 8;
  floatCountNonSqu[8] = 0xc;
  floatCountNonSqu[9] = 0xc;
  floatCountNonSqu[2] = 6;
  floatCountNonSqu[3] = 6;
  floatCountNonSqu[4] = 0xc;
  floatCountNonSqu[5] = 0xc;
  floatCount = (int *)0x600000006;
  floatCountNonSqu[0] = 8;
  floatCountNonSqu[1] = 8;
  data[0x67] = 1.45735e-43;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2e8,"uValM",&local_2e9);
  std::allocator<char>::~allocator(&local_2e9);
  tcu::TestLog::operator<<
            ((MessageBuilder *)((long)&name.field_2 + 8),this_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)((long)&name.field_2 + 8),
                       (char (*) [44])"Begin:ProgramUniformCase for Matrix iterate");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)((long)&name.field_2 + 8));
  locationA[0xb] = 0;
  for (k = 2; k < 5; k = k + 1) {
    for (local_2c0 = 2; local_2c0 < 5; local_2c0 = local_2c0 + 1) {
      for (uniformBaseName.field_2._12_4_ = 0; (int)uniformBaseName.field_2._12_4_ < 2;
          uniformBaseName.field_2._12_4_ = uniformBaseName.field_2._12_4_ + 1) {
        if ((k == local_2c0) && (bVar2)) {
          de::toString<int>(&local_520,&k);
          std::operator+(&local_500,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8,&local_520);
          std::operator+(&local_4e0,&local_500,"[");
          de::toString<int>((string *)((long)&name_1.field_2 + 8),
                            (int *)(uniformBaseName.field_2._M_local_buf + 0xc));
          std::operator+(&local_4c0,&local_4e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&name_1.field_2 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4a0,&local_4c0,"]");
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)(name_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::string::~string((string *)&local_520);
          pcVar1 = *(code **)(lVar6 + 0xb48);
          uVar7 = std::__cxx11::string::c_str();
          GVar4 = (*pcVar1)(programA,uVar7);
          locationB[(long)locationA[0xb] + 10] = GVar4;
          pcVar1 = *(code **)(lVar6 + 0xb48);
          uVar7 = std::__cxx11::string::c_str();
          iVar3 = (*pcVar1)(programB,uVar7);
          floatCountSqu[(long)locationA[0xb] + 10] = iVar3;
          locationA[0xb] = locationA[0xb] + 1;
          std::__cxx11::string::~string((string *)local_4a0);
        }
        else if ((k != local_2c0) && (!bVar2)) {
          de::toString<int>(&local_620,&k);
          std::operator+(&local_600,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8,&local_620);
          std::operator+(&local_5e0,&local_600,"x");
          de::toString<int>(&local_640,&local_2c0);
          std::operator+(&local_5c0,&local_5e0,&local_640);
          std::operator+(&local_5a0,&local_5c0,"[");
          de::toString<int>((string *)&value,(int *)(uniformBaseName.field_2._M_local_buf + 0xc));
          std::operator+(&local_580,&local_5a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_560,&local_580,"]");
          std::__cxx11::string::~string((string *)&local_580);
          std::__cxx11::string::~string((string *)&value);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::__cxx11::string::~string((string *)&local_640);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_600);
          std::__cxx11::string::~string((string *)&local_620);
          pcVar1 = *(code **)(lVar6 + 0xb48);
          uVar7 = std::__cxx11::string::c_str();
          GVar4 = (*pcVar1)(programA,uVar7);
          locationB[(long)locationA[0xb] + 10] = GVar4;
          pcVar1 = *(code **)(lVar6 + 0xb48);
          uVar7 = std::__cxx11::string::c_str();
          iVar3 = (*pcVar1)(programB,uVar7);
          floatCountSqu[(long)locationA[0xb] + 10] = iVar3;
          locationA[0xb] = locationA[0xb] + 1;
          std::__cxx11::string::~string((string *)local_560);
        }
      }
    }
  }
  for (k = 0; k < 0x68; k = k + 1) {
    (&j)[k] = (int)(float)(seed + k);
  }
  if (bVar2) {
    ppiStack_110 = (int **)(floatCountNonSqu + 10);
    (**(code **)(lVar6 + 0x1168))(programA,locationB[10],2,0,&j);
    (**(code **)(lVar6 + 0x1198))(programA,locationA[0],2,0,data + 6);
    (**(code **)(lVar6 + 0x11c8))(programA,locationA[2],2,0,data + 0x18);
  }
  else {
    ppiStack_110 = &floatCount;
    (**(code **)(lVar6 + 0x1178))(programA,locationB[10],2,0,&j);
    (**(code **)(lVar6 + 0x1188))(programA,locationA[0],2,0,data + 10);
    (**(code **)(lVar6 + 0x11a8))(programA,locationA[2],2,0,data + 0x1a);
    (**(code **)(lVar6 + 0x11b8))(programA,locationA[4],2,0,data + 0x26);
    (**(code **)(lVar6 + 0x11d8))(programA,locationA[6],2,0,data + 0x3e);
    (**(code **)(lVar6 + 0x11e8))(programA,locationA[8],2,0,data + 0x4e);
  }
  retValA._56_8_ = &j;
  k = 0;
  do {
    if (locationA[0xb] <= k) {
      j = (int)data[0x65];
      for (k = 1; k < 0x68; k = k + 1) {
        (&j)[k] = (int)((float)(&j)[k + -1] + 1.0);
      }
      if (bVar2) {
        ppiStack_110 = (int **)(floatCountNonSqu + 10);
        (**(code **)(lVar6 + 0x1168))(programB,floatCountSqu[10],2,0,&j);
        (**(code **)(lVar6 + 0x1198))(programB,locationB[0],2,0,data + 6);
        (**(code **)(lVar6 + 0x11c8))(programB,locationB[2],2,0,data + 0x18);
      }
      else {
        ppiStack_110 = &floatCount;
        (**(code **)(lVar6 + 0x1178))(programB,floatCountSqu[10],2,0,&j);
        (**(code **)(lVar6 + 0x1188))(programB,locationB[0],2,0,data + 10);
        (**(code **)(lVar6 + 0x11a8))(programB,locationB[2],2,0,data + 0x1a);
        (**(code **)(lVar6 + 0x11b8))(programB,locationB[4],2,0,data + 0x26);
        (**(code **)(lVar6 + 0x11d8))(programB,locationB[6],2,0,data + 0x3e);
        (**(code **)(lVar6 + 0x11e8))(programB,locationB[8],2,0,data + 0x4e);
      }
      retValA._56_8_ = &j;
      k = 0;
      do {
        if (locationA[0xb] <= k) {
          location._4_4_ = 0;
          if (pipeline != 0) {
            (**(code **)(lVar6 + 0x9a0))(pipeline,0x8259,(long)&location + 4);
          }
          if ((location._4_4_ != 0) &&
             ((location._4_4_ == programA || (location._4_4_ == programB)))) {
            if (location._4_4_ == programA) {
              local_830 = locationB;
            }
            else {
              local_830 = floatCountSqu;
            }
            local_830 = local_830 + 10;
            retVal._56_8_ = local_830;
            j = (int)data[0x65];
            for (k = 1; k < 0x68; k = k + 1) {
              (&j)[k] = (int)((float)(&j)[k + -1] + 1.0);
            }
            if (bVar2) {
              ppiStack_110 = (int **)(floatCountNonSqu + 10);
              (**(code **)(lVar6 + 0x15e0))(*local_830,2,0,&j);
              (**(code **)(lVar6 + 0x1610))(*(undefined4 *)(retVal._56_8_ + 8),2,0,data + 6);
              (**(code **)(lVar6 + 0x1640))(*(undefined4 *)(retVal._56_8_ + 0x10),2,0,data + 0x18);
            }
            else {
              ppiStack_110 = &floatCount;
              (**(code **)(lVar6 + 0x15f0))(*local_830,2,0,&j);
              (**(code **)(lVar6 + 0x1600))(*(undefined4 *)(retVal._56_8_ + 8),2,0,data + 10);
              (**(code **)(lVar6 + 0x1620))(*(undefined4 *)(retVal._56_8_ + 0x10),2,0,data + 0x1a);
              (**(code **)(lVar6 + 0x1630))(*(undefined4 *)(retVal._56_8_ + 0x18),2,0,data + 0x26);
              (**(code **)(lVar6 + 0x1650))(*(undefined4 *)(retVal._56_8_ + 0x20),2,0,data + 0x3e);
              (**(code **)(lVar6 + 0x1660))(*(undefined4 *)(retVal._56_8_ + 0x28),2,0,data + 0x4e);
            }
            retValA._56_8_ = &j;
            for (k = 0; k < locationA[0xb]; k = k + 1) {
              (**(code **)(lVar6 + 0xb60))
                        (location._4_4_,*(undefined4 *)(retVal._56_8_ + (long)k * 4),local_7b8);
              for (local_2c0 = 0; local_2c0 < *(int *)((long)ppiStack_110 + (long)k * 4);
                  local_2c0 = local_2c0 + 1) {
                if ((local_7b8[local_2c0] != *(float *)retValA._56_8_) ||
                   (NAN(local_7b8[local_2c0]) || NAN(*(float *)retValA._56_8_))) {
                  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar8,"ActiveShaderProgram with glUniform failed",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                             ,0x74e);
                  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
                retValA._56_8_ = retValA._56_8_ + 4;
              }
            }
          }
          std::__cxx11::string::~string((string *)local_2e8);
          return true;
        }
        (**(code **)(lVar6 + 0xb60))(programA,locationB[(long)k + 10],retValB_1 + 0xe);
        (**(code **)(lVar6 + 0xb60))(programB,floatCountSqu[(long)k + 10],&local_768);
        for (local_2c0 = 0; local_2c0 < *(int *)((long)ppiStack_110 + (long)k * 4);
            local_2c0 = local_2c0 + 1) {
          if (((&local_768)[local_2c0] != *(float *)retValA._56_8_) ||
             (NAN((&local_768)[local_2c0]) || NAN(*(float *)retValA._56_8_))) {
LAB_013cadb3:
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,"ProgramUniformi failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x70e);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          if ((retValB_1[(long)local_2c0 + 0xe] == (&local_768)[local_2c0]) &&
             (!NAN(retValB_1[(long)local_2c0 + 0xe]) && !NAN((&local_768)[local_2c0])))
          goto LAB_013cadb3;
          retValA._56_8_ = retValA._56_8_ + 4;
        }
        k = k + 1;
      } while( true );
    }
    (**(code **)(lVar6 + 0xb60))(programA,locationB[(long)k + 10],retValB + 0xe);
    (**(code **)(lVar6 + 0xb60))(programB,floatCountSqu[(long)k + 10],retValA_1 + 0xe);
    for (local_2c0 = 0; local_2c0 < *(int *)((long)ppiStack_110 + (long)k * 4);
        local_2c0 = local_2c0 + 1) {
      if ((retValB[(long)local_2c0 + 0xe] != *(float *)retValA._56_8_) ||
         (NAN(retValB[(long)local_2c0 + 0xe]) || NAN(*(float *)retValA._56_8_))) {
LAB_013ca9be:
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x6d8);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if ((retValB[(long)local_2c0 + 0xe] == retValA_1[(long)local_2c0 + 0xe]) &&
         (!NAN(retValB[(long)local_2c0 + 0xe]) && !NAN(retValA_1[(long)local_2c0 + 0xe])))
      goto LAB_013ca9be;
      retValA._56_8_ = retValA._56_8_ + 4;
    }
    k = k + 1;
  } while( true );
}

Assistant:

bool setAndCompareMatrixUniforms(glw::GLuint pipeline, glw::GLuint programA, glw::GLuint programB,
									 glu::DataType dType, int seed)
	{
		TestLog&			  log		  = m_testCtx.getLog();
		const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
		bool				  isSquareMat = isDataTypeSquareMatrix(dType);
		// The matrix versions of the fragment shader have two element arrays
		// of each uniform.
		// There are 3 * 2 uniforms for the square matrix shader and
		// 6 * 2 uniforms in the non-square matrix shader.
		const int  maxUniforms = 12;
		int		   numUniforms;
		const int  arraySize = 2;
		glw::GLint locationA[maxUniforms];
		glw::GLint locationB[maxUniforms];
		// These arrays represent the number of floats for each uniform location
		// 2x2[0], 2x2[1], 3x3[0], 3x3[1], 4x4[0], 4x4[1]
		const int floatCountSqu[maxUniforms] = { 4, 4, 9, 9, 16, 16, 0, 0, 0, 0, 0, 0 };
		// 2x3[0], 2x3[1], 2x4[0], 2x4[1], 3x2[0], 3x2[1], 3x4[0], 3x4[1], 4x2[0]...
		const int  floatCountNonSqu[maxUniforms] = { 6, 6, 8, 8, 6, 6, 12, 12, 8, 8, 12, 12 };
		const int* floatCount;
		// Max data for the uniforms = 2*(2*3 + 3*2 + 2*4 + 4*2 + 3*4 + 4*3)
		const int   maxDataCount = 104;
		float		data[maxDataCount];
		int			i, j, k;
		std::string uniformBaseName("uValM");

		// ProgramUniform API verification
		log << TestLog::Message << "Begin:ProgramUniformCase for Matrix iterate" << TestLog::EndMessage;

		numUniforms = 0;
		// get uniform locations
		for (i = 2; i <= 4; i++) // matrix dimension m
		{
			for (j = 2; j <= 4; j++) // matrix dimension n
			{
				for (k = 0; k < arraySize; k++)
				{
					if ((i == j) && isSquareMat)
					{
						string name			   = uniformBaseName + de::toString(i) + "[" + de::toString(k) + "]";
						locationA[numUniforms] = gl.getUniformLocation(programA, name.c_str());
						locationB[numUniforms] = gl.getUniformLocation(programB, name.c_str());
						numUniforms++;
					}
					else if ((i != j) && !isSquareMat)
					{
						string name =
							uniformBaseName + de::toString(i) + "x" + de::toString(j) + "[" + de::toString(k) + "]";
						locationA[numUniforms] = gl.getUniformLocation(programA, name.c_str());
						locationB[numUniforms] = gl.getUniformLocation(programB, name.c_str());
						numUniforms++;
					}
				}
			}
		}
		DE_ASSERT((numUniforms == 6) || (numUniforms == 12));

		// init the float data array
		for (i = 0; i < maxDataCount; i++)
		{
			data[i] = (float)(seed + i);
		}

		// Set the uniforms in programA
		float* value = &data[0];
		if (isSquareMat)
		{
			floatCount = floatCountSqu;
			gl.programUniformMatrix2fv(programA, locationA[0], arraySize, GL_FALSE, value);
			value += 2 * 2 * arraySize;
			gl.programUniformMatrix3fv(programA, locationA[2], arraySize, GL_FALSE, value);
			value += 3 * 3 * arraySize;
			gl.programUniformMatrix4fv(programA, locationA[4], arraySize, GL_FALSE, value);
		}
		else
		{
			floatCount = floatCountNonSqu;
			gl.programUniformMatrix2x3fv(programA, locationA[0], arraySize, GL_FALSE, value);
			value += 2 * 3 * arraySize;
			gl.programUniformMatrix2x4fv(programA, locationA[2], arraySize, GL_FALSE, value);
			value += 2 * 4 * arraySize;
			gl.programUniformMatrix3x2fv(programA, locationA[4], arraySize, GL_FALSE, value);
			value += 3 * 2 * arraySize;
			gl.programUniformMatrix3x4fv(programA, locationA[6], arraySize, GL_FALSE, value);
			value += 3 * 4 * arraySize;
			gl.programUniformMatrix4x2fv(programA, locationA[8], arraySize, GL_FALSE, value);
			value += 4 * 2 * arraySize;
			gl.programUniformMatrix4x3fv(programA, locationA[10], arraySize, GL_FALSE, value);
		}

		// get and compare the uniform data
		value = &data[0];
		for (i = 0; i < numUniforms; i++)
		{
			float retValA[16], retValB[16];

			gl.getUniformfv(programA, locationA[i], retValA);
			gl.getUniformfv(programB, locationB[i], retValB);

			for (j = 0; j < floatCount[i]; j++)
			{
				// Compare programA uniform to expected value and
				// test to see if programB picked up the value.
				if ((retValA[j] != *value++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// reseed the float buffer
		data[0] = data[maxDataCount - 1];
		for (i = 1; i < maxDataCount; i++)
		{
			data[i] = data[i - 1] + 1.0f;
		}

		// set uniforms in program B
		value = &data[0];
		if (isSquareMat)
		{
			floatCount = floatCountSqu;
			gl.programUniformMatrix2fv(programB, locationB[0], arraySize, GL_FALSE, value);
			value += 2 * 2 * arraySize;
			gl.programUniformMatrix3fv(programB, locationB[2], arraySize, GL_FALSE, value);
			value += 3 * 3 * arraySize;
			gl.programUniformMatrix4fv(programB, locationB[4], arraySize, GL_FALSE, value);
		}
		else
		{
			floatCount = floatCountNonSqu;
			gl.programUniformMatrix2x3fv(programB, locationB[0], arraySize, GL_FALSE, value);
			value += 2 * 3 * arraySize;
			gl.programUniformMatrix2x4fv(programB, locationB[2], arraySize, GL_FALSE, value);
			value += 2 * 4 * arraySize;
			gl.programUniformMatrix3x2fv(programB, locationB[4], arraySize, GL_FALSE, value);
			value += 3 * 2 * arraySize;
			gl.programUniformMatrix3x4fv(programB, locationB[6], arraySize, GL_FALSE, value);
			value += 3 * 4 * arraySize;
			gl.programUniformMatrix4x2fv(programB, locationB[8], arraySize, GL_FALSE, value);
			value += 4 * 2 * arraySize;
			gl.programUniformMatrix4x3fv(programB, locationB[10], arraySize, GL_FALSE, value);
		}

		// get and compare the uniform data
		value = &data[0];
		for (i = 0; i < numUniforms; i++)
		{
			float retValA[16], retValB[16];

			gl.getUniformfv(programA, locationA[i], retValA);
			gl.getUniformfv(programB, locationB[i], retValB);

			for (j = 0; j < floatCount[i]; j++)
			{
				// Compare programB uniform to expected value and
				// test to see if programA picked up the value.
				if ((retValB[j] != *value++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// Use the conventional uniform interfaces on an ACTIVE_PROGRAM
		glw::GLuint activeProgram = 0;
		if (pipeline != 0)
		{
			gl.getProgramPipelineiv(pipeline, GL_ACTIVE_PROGRAM, (int*)&activeProgram);
		}
		if ((activeProgram != 0) && ((activeProgram == programA) || (activeProgram == programB)))
		{
			glw::GLint* location;

			location = (activeProgram == programA) ? locationA : locationB;

			// reseed the float buffer
			data[0] = data[maxDataCount - 1];
			for (i = 1; i < maxDataCount; i++)
			{
				data[i] = data[i - 1] + 1.0f;
			}

			// set uniforms with conventional uniform calls
			value = &data[0];
			if (isSquareMat)
			{
				floatCount = floatCountSqu;
				gl.uniformMatrix2fv(location[0], arraySize, GL_FALSE, value);
				value += 2 * 2 * arraySize;
				gl.uniformMatrix3fv(location[2], arraySize, GL_FALSE, value);
				value += 3 * 3 * arraySize;
				gl.uniformMatrix4fv(location[4], arraySize, GL_FALSE, value);
			}
			else
			{
				floatCount = floatCountNonSqu;
				gl.uniformMatrix2x3fv(location[0], arraySize, GL_FALSE, value);
				value += 2 * 3 * arraySize;
				gl.uniformMatrix2x4fv(location[2], arraySize, GL_FALSE, value);
				value += 2 * 4 * arraySize;
				gl.uniformMatrix3x2fv(location[4], arraySize, GL_FALSE, value);
				value += 3 * 2 * arraySize;
				gl.uniformMatrix3x4fv(location[6], arraySize, GL_FALSE, value);
				value += 3 * 4 * arraySize;
				gl.uniformMatrix4x2fv(location[8], arraySize, GL_FALSE, value);
				value += 4 * 2 * arraySize;
				gl.uniformMatrix4x3fv(location[10], arraySize, GL_FALSE, value);
			}

			// get and compare the uniform data
			value = &data[0];
			for (i = 0; i < numUniforms; i++)
			{
				float retVal[16];

				gl.getUniformfv(activeProgram, location[i], retVal);

				for (j = 0; j < floatCount[i]; j++)
				{
					// Compare activeshaderprogram uniform to expected value
					if (retVal[j] != *value++)
					{
						TCU_FAIL("ActiveShaderProgram with glUniform failed");
					}
				}
			}
		}

		return true;
	}